

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O1

void calling_value_text_multiple_times(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  size_t len;
  char *str;
  char *str2;
  size_t len2;
  AssertionHandler catchAssertionHandler;
  size_t local_120;
  char *local_118;
  SourceLineInfo local_110;
  char *local_100;
  size_t local_f8;
  ITransientExpression local_f0;
  char **local_e0;
  char *local_d8;
  size_t sStack_d0;
  char **local_c8;
  AssertionHandler local_c0;
  sqlite3_context *local_78;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_f0._vptr_ITransientExpression = (_func_int **)0x185460;
  local_f0.m_isBinaryExpression = true;
  local_f0.m_result = false;
  local_f0._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_110.line = 0xd9;
  local_78 = context;
  Catch::StringRef::StringRef
            (&local_40,
             "(duckdb_shell_sqlite3_value_type(argv[0]) == 1 || duckdb_shell_sqlite3_value_type(argv[0]) == 2 || duckdb_shell_sqlite3_value_type(argv[0]) == 3)"
            );
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,(StringRef *)&local_f0,&local_110,local_40,Normal);
  iVar5 = duckdb_shell_sqlite3_value_type(*argv);
  bVar7 = true;
  if (iVar5 != 1) {
    iVar5 = duckdb_shell_sqlite3_value_type(*argv);
    if (iVar5 != 2) {
      iVar5 = duckdb_shell_sqlite3_value_type(*argv);
      bVar7 = iVar5 == 3;
    }
  }
  local_f0._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_f0._vptr_ITransientExpression._1_7_,bVar7);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_f0);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_118 = (char *)duckdb_shell_sqlite3_value_text(*argv);
  local_f0._vptr_ITransientExpression = (_func_int **)0x185460;
  local_f0.m_isBinaryExpression = true;
  local_f0.m_result = false;
  local_f0._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_110.line = 0xdb;
  Catch::StringRef::StringRef(&local_50,"duckdb_shell_sqlite3_value_type(argv[0]) == 3");
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,(StringRef *)&local_f0,&local_110,local_50,Normal);
  iVar5 = duckdb_shell_sqlite3_value_type(*argv);
  local_120 = CONCAT44(local_120._4_4_,iVar5);
  local_f8 = CONCAT44(local_f8._4_4_,3);
  Catch::StringRef::StringRef((StringRef *)&local_110,"==");
  local_f0.m_result = iVar5 == 3;
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b6c70;
  local_d8 = local_110.file;
  sStack_d0 = local_110.line;
  local_e0 = (char **)&local_120;
  local_c8 = (char **)&local_f8;
  Catch::AssertionHandler::handleExpr(&local_c0,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_120 = strlen(local_118);
  lVar6 = 10;
  do {
    local_100 = (char *)duckdb_shell_sqlite3_value_text(*argv);
    local_f0._vptr_ITransientExpression = (_func_int **)0x185460;
    local_f0.m_isBinaryExpression = true;
    local_f0.m_result = false;
    local_f0._10_6_ = 0;
    local_110.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
    ;
    local_110.line = 0xe2;
    Catch::StringRef::StringRef(&local_60,"str == str2");
    Catch::AssertionHandler::AssertionHandler
              (&local_c0,(StringRef *)&local_f0,&local_110,local_60,Normal);
    pcVar3 = local_100;
    pcVar2 = local_118;
    Catch::StringRef::StringRef((StringRef *)&local_110,"==");
    local_f0.m_result = pcVar2 == pcVar3;
    local_f0.m_isBinaryExpression = true;
    local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b7c98;
    local_e0 = &local_118;
    local_d8 = local_110.file;
    sStack_d0 = local_110.line;
    local_c8 = &local_100;
    Catch::AssertionHandler::handleExpr(&local_c0,&local_f0);
    Catch::ITransientExpression::~ITransientExpression(&local_f0);
    Catch::AssertionHandler::complete(&local_c0);
    if (local_c0.m_completed == false) {
      (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x11])(local_c0.m_resultCapture,&local_c0);
    }
    local_f8 = strlen(local_100);
    local_f0._vptr_ITransientExpression = (_func_int **)0x185460;
    local_f0.m_isBinaryExpression = true;
    local_f0.m_result = false;
    local_f0._10_6_ = 0;
    local_110.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
    ;
    local_110.line = 0xe4;
    Catch::StringRef::StringRef(&local_70,"len == len2");
    Catch::AssertionHandler::AssertionHandler
              (&local_c0,(StringRef *)&local_f0,&local_110,local_70,Normal);
    sVar4 = local_f8;
    sVar1 = local_120;
    Catch::StringRef::StringRef((StringRef *)&local_110,"==");
    local_f0.m_result = sVar1 == sVar4;
    local_f0.m_isBinaryExpression = true;
    local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b7c58;
    local_e0 = (char **)&local_120;
    local_d8 = local_110.file;
    sStack_d0 = local_110.line;
    local_c8 = (char **)&local_f8;
    Catch::AssertionHandler::handleExpr(&local_c0,&local_f0);
    Catch::ITransientExpression::~ITransientExpression(&local_f0);
    Catch::AssertionHandler::complete(&local_c0);
    if (local_c0.m_completed == false) {
      (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x11])(local_c0.m_resultCapture,&local_c0);
    }
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  iVar5 = duckdb_shell_sqlite3_value_bytes(*argv);
  local_120 = (size_t)iVar5;
  duckdb_shell_sqlite3_result_text(local_78,local_118,local_120,0);
  return;
}

Assistant:

static void calling_value_text_multiple_times(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE((sqlite3_value_type(argv[0]) == SQLITE_INTEGER || sqlite3_value_type(argv[0]) == SQLITE_FLOAT ||
	         sqlite3_value_type(argv[0]) == SQLITE_TEXT));
	char *str = (char *)sqlite3_value_text(argv[0]);
	REQUIRE(sqlite3_value_type(argv[0]) == SQLITE_TEXT);
	auto len = strlen(str);
	size_t len2;
	char *str2;
	// calling sqlite3_value_text multiple times,  i.e., 10x
	for (size_t i = 0; i < 10; ++i) {
		str2 = (char *)sqlite3_value_text(argv[0]);
		REQUIRE(str == str2);
		len2 = strlen(str2);
		REQUIRE(len == len2);
	}
	len = sqlite3_value_bytes(argv[0]);
	sqlite3_result_text(context, str, len, nullptr);
}